

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cJSON.c
# Opt level: O3

cJSON * cJSON_CreateStringArray(char **strings,int count)

{
  cJSON *pcVar1;
  cJSON *pcVar2;
  ulong uVar3;
  cJSON *pcVar4;
  
  pcVar1 = (cJSON *)(*cJSON_malloc)(0x40);
  if (pcVar1 != (cJSON *)0x0) {
    pcVar1->child = (cJSON *)0x0;
    *(undefined8 *)&pcVar1->type = 0;
    pcVar1->valuedouble = 0.0;
    pcVar1->string = (char *)0x0;
    pcVar1->valuestring = (char *)0x0;
    *(undefined8 *)&pcVar1->valueint = 0;
    pcVar1->next = (cJSON *)0x0;
    pcVar1->prev = (cJSON *)0x0;
    pcVar1->type = 5;
    if (0 < count) {
      uVar3 = 0;
      pcVar4 = (cJSON *)0x0;
      do {
        pcVar2 = cJSON_CreateString(strings[uVar3]);
        if (uVar3 == 0) {
          pcVar1->child = pcVar2;
        }
        else {
          pcVar4->next = pcVar2;
          pcVar2->prev = pcVar4;
        }
        uVar3 = uVar3 + 1;
        pcVar4 = pcVar2;
      } while (uVar3 < (uint)count);
    }
  }
  return pcVar1;
}

Assistant:

cJSON *cJSON_CreateStringArray(const char **strings,int count)	{int i;cJSON *n=0,*p=0,*a=cJSON_CreateArray();for(i=0;a && i<count;i++){n=cJSON_CreateString(strings[i]);if(!i)a->child=n;else suffix_object(p,n);p=n;}return a;}